

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O1

int s_mp_mul_digs(mp_int *a,mp_int *b,mp_int *c,int digs)

{
  mp_digit *pmVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  mp_digit *pmVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  mp_digit mVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  mp_digit *pmVar19;
  mp_int t;
  mp_int local_98;
  int local_74;
  mp_int *local_70;
  mp_digit *local_68;
  mp_digit *local_60;
  long local_58;
  long local_50;
  mp_int local_48;
  
  if (digs < 0x200) {
    iVar7 = b->used;
    if (a->used < b->used) {
      iVar7 = a->used;
    }
    if (iVar7 < 0x100) {
      iVar7 = fast_s_mp_mul_digs(a,b,c,digs);
      return iVar7;
    }
  }
  iVar7 = mp_init_size(&local_98,digs);
  if (iVar7 == 0) {
    local_50 = (long)a->used;
    if (0 < local_50) {
      iVar7 = b->used;
      local_58 = (long)iVar7;
      local_60 = a->dp;
      pmVar1 = b->dp;
      lVar16 = 0;
      local_68 = local_98.dp;
      pmVar19 = local_98.dp;
      iVar17 = digs;
      do {
        iVar11 = iVar17;
        if (local_58 < iVar17) {
          iVar11 = iVar7;
        }
        iVar18 = iVar17;
        if (iVar7 < iVar17) {
          iVar18 = iVar7;
        }
        iVar8 = digs - (int)lVar16;
        if (iVar7 < iVar8) {
          iVar8 = iVar7;
        }
        if (iVar8 < 1) {
          pmVar9 = local_98.dp + lVar16;
          iVar18 = 0;
          mVar15 = 0;
        }
        else {
          uVar10 = local_60[lVar16];
          lVar14 = 0;
          lVar12 = 0;
          mVar15 = 0;
          do {
            auVar2._8_8_ = 0;
            auVar2._0_8_ = uVar10;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = pmVar1[lVar12];
            auVar4[8] = CARRY8(mVar15,pmVar19[lVar12]);
            auVar4._0_8_ = mVar15 + pmVar19[lVar12];
            auVar4._9_7_ = 0;
            auVar4 = auVar2 * auVar3 + auVar4;
            uVar13 = auVar4._0_8_;
            mVar15 = auVar4._8_8_ << 4 | uVar13 >> 0x3c;
            pmVar19[lVar12] = uVar13 & 0xfffffffffffffff;
            lVar12 = lVar12 + 1;
            lVar14 = lVar14 + -8;
          } while (iVar11 != (int)lVar12);
          pmVar9 = (mp_digit *)((long)pmVar19 - lVar14);
        }
        if ((int)lVar16 + iVar18 < digs) {
          *pmVar9 = mVar15;
        }
        lVar16 = lVar16 + 1;
        iVar17 = iVar17 + -1;
        pmVar19 = pmVar19 + 1;
        local_74 = digs;
      } while (lVar16 != local_50);
    }
    local_48.used = digs;
    if (0 < digs) {
      uVar10 = (ulong)(uint)digs;
      if (local_98.dp[(ulong)(uint)digs - 1] == 0) {
        do {
          if ((long)uVar10 < 2) {
            uVar13 = 0;
            digs = 0;
            goto LAB_00104dda;
          }
          uVar13 = uVar10 - 1;
          lVar16 = uVar10 - 2;
          uVar10 = uVar13;
        } while (local_98.dp[lVar16] == 0);
        digs = (int)uVar13;
      }
      else {
        uVar13 = (ulong)(uint)digs;
      }
LAB_00104dda:
      local_48.used = (int)uVar13;
    }
    if (digs == 0) {
      local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
    }
    local_48.dp = local_98.dp;
    local_48.alloc = local_98.alloc;
    local_48.sign = local_98.sign;
    local_48._12_4_ = local_98._12_4_;
    pmVar1 = c->dp;
    uVar5._0_4_ = c->used;
    uVar5._4_4_ = c->alloc;
    uVar6._0_4_ = c->sign;
    uVar6._4_4_ = *(undefined4 *)&c->field_0xc;
    c->used = local_48.used;
    c->alloc = local_98.alloc;
    c->sign = local_98.sign;
    *(undefined4 *)&c->field_0xc = local_98._12_4_;
    c->dp = local_98.dp;
    if (pmVar1 == (mp_digit *)0x0) {
      iVar7 = 0;
    }
    else {
      local_98._0_8_ = uVar5;
      local_98._8_8_ = uVar6;
      local_98.dp = pmVar1;
      local_70 = c;
      if (0 < (long)(int)uVar5) {
        memset(pmVar1,0,(long)(int)uVar5 << 3);
      }
      free(pmVar1);
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

int s_mp_mul_digs (mp_int * a, mp_int * b, mp_int * c, int digs)
{
  mp_int  t;
  int     res, pa, pb, ix, iy;
  mp_digit u;
  mp_word r;
  mp_digit tmpx, *tmpt, *tmpy;

  /* can we use the fast multiplier? */
  if (((digs) < MP_WARRAY) &&
      MIN (a->used, b->used) < 
          (1 << ((CHAR_BIT * sizeof (mp_word)) - (2 * DIGIT_BIT)))) {
    return fast_s_mp_mul_digs (a, b, c, digs);
  }

  if ((res = mp_init_size (&t, digs)) != MP_OKAY) {
    return res;
  }
  t.used = digs;

  /* compute the digits of the product directly */
  pa = a->used;
  for (ix = 0; ix < pa; ix++) {
    /* set the carry to zero */
    u = 0;

    /* limit ourselves to making digs digits of output */
    pb = MIN (b->used, digs - ix);

    /* setup some aliases */
    /* copy of the digit from a used within the nested loop */
    tmpx = a->dp[ix];
    
    /* an alias for the destination shifted ix places */
    tmpt = t.dp + ix;
    
    /* an alias for the digits of b */
    tmpy = b->dp;

    /* compute the columns of the output and propagate the carry */
    for (iy = 0; iy < pb; iy++) {
      /* compute the column as a mp_word */
      r       = ((mp_word)*tmpt) +
                ((mp_word)tmpx) * ((mp_word)*tmpy++) +
                ((mp_word) u);

      /* the new column is the lower part of the result */
      *tmpt++ = (mp_digit) (r & ((mp_word) MP_MASK));

      /* get the carry word from the result */
      u       = (mp_digit) (r >> ((mp_word) DIGIT_BIT));
    }
    /* set carry if it is placed below digs */
    if (ix + iy < digs) {
      *tmpt = u;
    }
  }

  mp_clamp (&t);
  mp_exch (&t, c);

  mp_clear (&t);
  return MP_OKAY;
}